

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

int randomx::scheduleUop<false>(type_conflict uop,type_conflict (*portBusy) [174] [3],int cycle)

{
  int cycle_local;
  type_conflict (*portBusy_local) [174] [3];
  type_conflict uop_local;
  
  cycle_local = cycle;
  while( true ) {
    if (0xad < cycle_local) {
      return -1;
    }
    if (((uop & 4U) != 0) && ((*portBusy)[cycle_local][2] == 0)) {
      return cycle_local;
    }
    if (((uop & 1U) != 0) && ((*portBusy)[cycle_local][0] == 0)) {
      return cycle_local;
    }
    if (((uop & 2U) != 0) && ((*portBusy)[cycle_local][1] == 0)) break;
    cycle_local = cycle_local + 1;
  }
  return cycle_local;
}

Assistant:

static int scheduleUop(ExecutionPort::type uop, ExecutionPort::type(&portBusy)[CYCLE_MAP_SIZE][3], int cycle) {
		//The scheduling here is done optimistically by checking port availability in order P5 -> P0 -> P1 to not overload
		//port P1 (multiplication) by instructions that can go to any port.
		for (; cycle < CYCLE_MAP_SIZE; ++cycle) {
			if ((uop & ExecutionPort::P5) != 0 && !portBusy[cycle][2]) {
				if (commit) {
					if (trace) std::cout << "; P5 at cycle " << cycle << std::endl;
					portBusy[cycle][2] = uop;
				}
				return cycle;
			}
			if ((uop & ExecutionPort::P0) != 0 && !portBusy[cycle][0]) {
				if (commit) {
					if (trace) std::cout << "; P0 at cycle " << cycle << std::endl;
					portBusy[cycle][0] = uop;
				}
				return cycle;
			}
			if ((uop & ExecutionPort::P1) != 0 && !portBusy[cycle][1]) {
				if (commit) {
					if (trace) std::cout << "; P1 at cycle " << cycle << std::endl;
					portBusy[cycle][1] = uop;
				}
				return cycle;
			}
		}
		return -1;
	}